

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowReturnOneRow(WindowCodeArg *p)

{
  Window *pWVar1;
  Vdbe *p_00;
  Parse *pParse_00;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int p2;
  int p2_00;
  int iVar5;
  int p3;
  int tmpReg2;
  int op;
  int val;
  int iEph;
  int tmpReg_1;
  int lbl_1;
  int csr_1;
  int nArg;
  int tmpReg;
  int lbl;
  int csr;
  FuncDef *pFunc;
  Window *pWin;
  Parse *pParse;
  Vdbe *v;
  Window *pMWin;
  WindowCodeArg *p_local;
  
  pWVar1 = p->pMWin;
  p_00 = p->pVdbe;
  if (pWVar1->regStartRowid == 0) {
    pParse_00 = p->pParse;
    for (pFunc = (FuncDef *)pWVar1; pFunc != (FuncDef *)0x0; pFunc = (pFunc->u).pHash) {
      pvVar2 = pFunc[1].pUserData;
      if ((*(char **)((long)pvVar2 + 0x38) == "nth_value") ||
         (*(char **)((long)pvVar2 + 0x38) == "first_value")) {
        iVar5 = *(int *)((long)&pFunc[1].xSFunc + 4);
        iVar3 = sqlite3VdbeMakeLabel(pParse_00);
        iVar4 = sqlite3GetTempReg(pParse_00);
        sqlite3VdbeAddOp2(p_00,0x4b,0,*(int *)&pFunc[1].xSFunc);
        if (*(char **)((long)pvVar2 + 0x38) == "nth_value") {
          sqlite3VdbeAddOp3(p_00,0x5e,pWVar1->iEphCsr,*(int *)((long)&pFunc[1].xInverse + 4) + 1,
                            iVar4);
          windowCheckValue(pParse_00,iVar4,2);
        }
        else {
          sqlite3VdbeAddOp2(p_00,0x47,1,iVar4);
        }
        sqlite3VdbeAddOp3(p_00,0x6a,iVar4,*(int *)&pFunc[1].xFinalize,iVar4);
        sqlite3VdbeAddOp3(p_00,0x36,*(int *)&pFunc[1].xFinalize + 1,iVar3,iVar4);
        sqlite3VdbeAddOp3(p_00,0x1d,iVar5,0,iVar4);
        sqlite3VdbeAddOp3(p_00,0x5e,iVar5,*(int *)((long)&pFunc[1].xInverse + 4),
                          *(int *)&pFunc[1].xSFunc);
        sqlite3VdbeResolveLabel(p_00,iVar3);
        sqlite3ReleaseTempReg(pParse_00,iVar4);
      }
      else if ((*(char **)((long)pvVar2 + 0x38) == "lead") ||
              (*(char **)((long)pvVar2 + 0x38) == "lag")) {
        iVar5 = **(int **)(pFunc[1].xValue + 0x20);
        iVar3 = *(int *)((long)&pFunc[1].xSFunc + 4);
        p2 = sqlite3VdbeMakeLabel(pParse_00);
        p2_00 = sqlite3GetTempReg(pParse_00);
        iVar4 = pWVar1->iEphCsr;
        if (iVar5 < 3) {
          sqlite3VdbeAddOp2(p_00,0x4b,0,*(int *)&pFunc[1].xSFunc);
        }
        else {
          sqlite3VdbeAddOp3(p_00,0x5e,iVar4,*(int *)((long)&pFunc[1].xInverse + 4) + 2,
                            *(int *)&pFunc[1].xSFunc);
        }
        sqlite3VdbeAddOp2(p_00,0x87,iVar4,p2_00);
        if (iVar5 < 2) {
          iVar5 = -1;
          if (*(char **)((long)pvVar2 + 0x38) == "lead") {
            iVar5 = 1;
          }
          sqlite3VdbeAddOp2(p_00,0x56,p2_00,iVar5);
        }
        else {
          iVar5 = 0x6b;
          if (*(char **)((long)pvVar2 + 0x38) == "lead") {
            iVar5 = 0x6a;
          }
          p3 = sqlite3GetTempReg(pParse_00);
          sqlite3VdbeAddOp3(p_00,0x5e,iVar4,*(int *)((long)&pFunc[1].xInverse + 4) + 1,p3);
          sqlite3VdbeAddOp3(p_00,iVar5,p3,p2_00,p2_00);
          sqlite3ReleaseTempReg(pParse_00,p3);
        }
        sqlite3VdbeAddOp3(p_00,0x1d,iVar3,p2,p2_00);
        sqlite3VdbeAddOp3(p_00,0x5e,iVar3,*(int *)((long)&pFunc[1].xInverse + 4),
                          *(int *)&pFunc[1].xSFunc);
        sqlite3VdbeResolveLabel(p_00,p2);
        sqlite3ReleaseTempReg(pParse_00,p2_00);
      }
    }
  }
  else {
    windowFullScan(p);
  }
  sqlite3VdbeAddOp2(p_00,9,p->regGosub,p->addrGosub);
  return;
}

Assistant:

static void windowReturnOneRow(WindowCodeArg *p){
  Window *pMWin = p->pMWin;
  Vdbe *v = p->pVdbe;

  if( pMWin->regStartRowid ){
    windowFullScan(p);
  }else{
    Parse *pParse = p->pParse;
    Window *pWin;

    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      FuncDef *pFunc = pWin->pWFunc;
      assert( ExprUseXList(pWin->pOwner) );
      if( pFunc->zName==nth_valueName
       || pFunc->zName==first_valueName
      ){
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);

        if( pFunc->zName==nth_valueName ){
          sqlite3VdbeAddOp3(v, OP_Column,pMWin->iEphCsr,pWin->iArgCol+1,tmpReg);
          windowCheckValue(pParse, tmpReg, 2);
        }else{
          sqlite3VdbeAddOp2(v, OP_Integer, 1, tmpReg);
        }
        sqlite3VdbeAddOp3(v, OP_Add, tmpReg, pWin->regApp, tmpReg);
        sqlite3VdbeAddOp3(v, OP_Gt, pWin->regApp+1, lbl, tmpReg);
        VdbeCoverageNeverNull(v);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, 0, tmpReg);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
      else if( pFunc->zName==leadName || pFunc->zName==lagName ){
        int nArg = pWin->pOwner->x.pList->nExpr;
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        int iEph = pMWin->iEphCsr;

        if( nArg<3 ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
        }else{
          sqlite3VdbeAddOp3(v, OP_Column, iEph,pWin->iArgCol+2,pWin->regResult);
        }
        sqlite3VdbeAddOp2(v, OP_Rowid, iEph, tmpReg);
        if( nArg<2 ){
          int val = (pFunc->zName==leadName ? 1 : -1);
          sqlite3VdbeAddOp2(v, OP_AddImm, tmpReg, val);
        }else{
          int op = (pFunc->zName==leadName ? OP_Add : OP_Subtract);
          int tmpReg2 = sqlite3GetTempReg(pParse);
          sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+1, tmpReg2);
          sqlite3VdbeAddOp3(v, op, tmpReg2, tmpReg, tmpReg);
          sqlite3ReleaseTempReg(pParse, tmpReg2);
        }

        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, lbl, tmpReg);
        VdbeCoverage(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
    }
  }
  sqlite3VdbeAddOp2(v, OP_Gosub, p->regGosub, p->addrGosub);
}